

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void __thiscall Parser_TokenizerErrors_Test::TestBody(Parser_TokenizerErrors_Test *this)

{
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> uVar1;
  char *in_R9;
  bool gotError;
  AssertHelper local_1c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  string local_1a8;
  AssertionResult gtest_ar_;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> local_178;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> local_158;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> local_138;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> local_118;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  gotError = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Shape\"sphere\"\t\t # foo bar\n\"float radius",
             (allocator<char> *)&local_1a8);
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:75:20)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:75:20)>
             ::_M_manager;
  local_98._M_unused._M_object = &gotError;
  pbrt::Tokenizer::CreateFromString((string *)&t,&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::__cxx11::string::~string((string *)&local_118);
  uVar1 = t;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
       t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
       super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0;
  if ((__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
      t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
      super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"t.get() != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
               ,0x50,local_1a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
LAB_002ee507:
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    extract_abi_cxx11_(&local_30,
                       (Tokenizer *)
                       t._M_t.
                       super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>
                       .super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30);
    gtest_ar_.success_ = gotError;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gotError == false) {
      testing::Message::Message((Message *)&local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"gotError","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                 ,0x52,local_1a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
      goto LAB_002ee507;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr(&t);
  if ((__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
      uVar1._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
      super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0) {
    return;
  }
  gotError = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Shape\"sphere\"\t\t # foo bar\n\"float radius",
             (allocator<char> *)&local_1a8);
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:87:20)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:87:20)>
             ::_M_manager;
  local_b8._M_unused._M_object = &gotError;
  pbrt::Tokenizer::CreateFromString((string *)&t,&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::__cxx11::string::~string((string *)&local_138);
  uVar1 = t;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
       t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
       super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0;
  if ((__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
      t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
      super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"t.get() != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
               ,0x5c,local_1a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
LAB_002ee6c0:
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    extract_abi_cxx11_(&local_48,
                       (Tokenizer *)
                       t._M_t.
                       super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>
                       .super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    gtest_ar_.success_ = gotError;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gotError == false) {
      testing::Message::Message((Message *)&local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"gotError","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                 ,0x5e,local_1a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
      goto LAB_002ee6c0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr(&t);
  if ((__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
      uVar1._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
      super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0) {
    return;
  }
  gotError = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Shape\"sphere\"\t\t # foo bar\n\"float radius\\",
             (allocator<char> *)&local_1a8);
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:99:20)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:99:20)>
             ::_M_manager;
  local_d8._M_unused._M_object = &gotError;
  pbrt::Tokenizer::CreateFromString((string *)&t,&local_158);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  uVar1 = t;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
       t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
       super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0;
  if ((__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
      t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
      super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"t.get() != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
               ,0x68,local_1a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
LAB_002ee870:
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    extract_abi_cxx11_(&local_60,
                       (Tokenizer *)
                       t._M_t.
                       super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>
                       .super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    gtest_ar_.success_ = gotError;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gotError == false) {
      testing::Message::Message((Message *)&local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"gotError","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
                 ,0x6a,local_1a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
      goto LAB_002ee870;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr(&t);
  if ((__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
      uVar1._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
      super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0) {
    return;
  }
  gotError = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Shape\"sphere\"\t\t # foo bar\n\"float radius\n\" 5",
             (allocator<char> *)&local_1a8);
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:111:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp:111:20)>
             ::_M_manager;
  local_f8._M_unused._M_object = &gotError;
  pbrt::Tokenizer::CreateFromString((string *)&t,&local_178);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::__cxx11::string::~string((string *)&local_178);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
       t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
       super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0;
  if ((__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)
      t._M_t.super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>.
      super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"t.get() != nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
               ,0x74,local_1a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    extract_abi_cxx11_(&local_78,
                       (Tokenizer *)
                       t._M_t.
                       super___uniq_ptr_impl<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>
                       .super__Head_base<0UL,_pbrt::Tokenizer_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    gtest_ar_.success_ = gotError;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gotError != false) goto LAB_002eea3c;
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)&gtest_ar_,(AssertionResult *)"gotError","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser_test.cpp"
               ,0x76,local_1a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_1b8);
LAB_002eea3c:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr(&t);
  return;
}

Assistant:

TEST(Parser, TokenizerErrors) {
    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "premature EOF");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }

    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "premature EOF");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }

    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "premature EOF");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius\\", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }

    {
        bool gotError = false;
        auto err = [&](const char *err, const FileLoc *) {
            gotError = !strcmp(err, "unterminated string");
        };
        auto t = Tokenizer::CreateFromString(
            "Shape\"sphere\"\t\t # foo bar\n\"float radius\n\" 5", err);
        ASSERT_TRUE(t.get() != nullptr);
        extract(t.get());
        EXPECT_TRUE(gotError);
    }
}